

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbasictimer.cpp
# Opt level: O2

void __thiscall QBasicTimer::stop(QBasicTimer *this)

{
  bool bVar1;
  QAbstractEventDispatcher *this_00;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_id != Invalid) {
    this_00 = (QAbstractEventDispatcher *)QAbstractEventDispatcher::instance((QThread *)0x0);
    if (this_00 != (QAbstractEventDispatcher *)0x0) {
      bVar1 = QAbstractEventDispatcher::unregisterTimer(this_00,this->m_id);
      if (!bVar1) {
        local_30.context.version = 2;
        local_30.context.function._4_4_ = 0;
        local_30.context._4_8_ = 0;
        local_30.context._12_8_ = 0;
        local_30.context.category = "default";
        QMessageLogger::warning
                  (&local_30,
                   "QBasicTimer::stop: Failed. Possibly trying to stop from a different thread");
        goto LAB_002520a5;
      }
    }
    QAbstractEventDispatcherPrivate::releaseTimerId(this->m_id);
  }
  this->m_id = Invalid;
LAB_002520a5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBasicTimer::stop()
{
    if (isActive()) {
        QAbstractEventDispatcher *eventDispatcher = QAbstractEventDispatcher::instance();
        if (eventDispatcher && !eventDispatcher->unregisterTimer(m_id)) {
            qWarning("QBasicTimer::stop: Failed. Possibly trying to stop from a different thread");
            return;
        }
        QAbstractEventDispatcherPrivate::releaseTimerId(m_id);
    }
    m_id = Qt::TimerId::Invalid;
}